

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToLast(DBIter *this)

{
  this->direction_ = kReverse;
  ClearSavedValue(this);
  (*this->iter_->_vptr_Iterator[4])();
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::SeekToLast() {
  direction_ = kReverse;
  ClearSavedValue();
  iter_->SeekToLast();
  FindPrevUserEntry();
}